

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamReaderPrivate::checkPublicLiteral(QXmlStreamReaderPrivate *this,QStringView publicId)

{
  uint uVar1;
  storage_type_conflict sVar2;
  bool bVar3;
  long lVar4;
  undefined2 uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QAnyStringView a;
  undefined2 local_52;
  QString local_50;
  QString local_38;
  long local_20;
  
  lVar4 = publicId.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = 0 < lVar4;
  if ((lVar4 < 1) ||
     (sVar2 = publicId.m_data[lVar4 + -1], uVar6 = (uint)(ushort)sVar2, 0xff < (ushort)sVar2)) {
    uVar5 = 0;
  }
  else {
    do {
      uVar5 = (undefined2)uVar6;
      uVar1 = (uVar6 & 0xff) - 10;
      if (((((0x36 < uVar1) || ((0x6b003fefc00009U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
           ((uVar6 & 0xff) != 0x5f)) && ((9 < uVar6 - 0x30 && (0x19 < (uVar6 & 0xdf) - 0x41)))) ||
         (bVar3 = 1 < lVar4, lVar4 < 2)) break;
      uVar6 = (uint)(ushort)publicId.m_data[lVar4 + -2];
      lVar4 = lVar4 + -1;
    } while (uVar6 < 0x100);
  }
  if (bVar3) {
    QCoreApplication::translate
              (&local_50,"QXmlStream","Unexpected character \'%1\' in public id literal.",
               (char *)0x0,-1);
    a.m_size = 0x8000000000000001;
    a.field_0.m_data = &local_52;
    local_52 = uVar5;
    QString::arg_impl(&local_38,&local_50,a,0,(QChar)0x20);
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_38);
    this->type = Invalid;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::checkPublicLiteral(QStringView publicId)
{
//#x20 | #xD | #xA | [a-zA-Z0-9] | [-'()+,./:=?;!*#@$_%]

    const char16_t *data = publicId.utf16();
    uchar c = 0;
    qsizetype i;
    for (i = publicId.size() - 1; i >= 0; --i) {
        if (data[i] < 256)
            switch ((c = data[i])) {
            case ' ': case '\n': case '\r': case '-': case '(': case ')':
            case '+': case ',': case '.': case '/': case ':': case '=':
            case '?': case ';': case '!': case '*': case '#': case '@':
            case '$': case '_': case '%': case '\'': case '\"':
                continue;
            default:
                if (isAsciiLetterOrNumber(c))
                    continue;
            }
        break;
    }
    if (i >= 0)
        raiseWellFormedError(QXmlStream::tr("Unexpected character '%1' in public id literal.").arg(QChar(QLatin1Char(c))));
}